

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O2

void __thiscall QGraphicsItemAnimation::setStep(QGraphicsItemAnimation *this,qreal step)

{
  QGraphicsItem *pQVar1;
  bool bVar2;
  long lVar3;
  long in_FS_OFFSET;
  QTransform local_d0;
  QTransform local_80;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = check_step_valid(step,"setStep");
  if (bVar2) {
    (**(code **)(*(long *)this + 0x60))(step,this);
    lVar3 = *(long *)(this + 0x10);
    *(qreal *)(lVar3 + 0x80) = step;
    pQVar1 = *(QGraphicsItem **)(lVar3 + 0x18);
    if (pQVar1 != (QGraphicsItem *)0x0) {
      if ((*(long *)(lVar3 + 0x98) != 0) || (*(long *)(lVar3 + 0xb0) != 0)) {
        local_80.m_matrix[0]._0_16_ = posAt(this,step);
        QGraphicsItem::setPos(pQVar1,(QPointF *)&local_80);
        lVar3 = *(long *)(this + 0x10);
      }
      if ((((*(long *)(lVar3 + 200) != 0) || (*(long *)(lVar3 + 0xe0) != 0)) ||
          (*(long *)(lVar3 + 0xf8) != 0)) ||
         (((*(long *)(lVar3 + 0x110) != 0 || (*(long *)(lVar3 + 0x128) != 0)) ||
          ((*(long *)(lVar3 + 0x140) != 0 || (*(long *)(lVar3 + 0x158) != 0)))))) {
        pQVar1 = *(QGraphicsItem **)(lVar3 + 0x18);
        transformAt(&local_d0,this,step);
        QTransform::operator*(&local_80,(QTransform *)(lVar3 + 0x30));
        QGraphicsItem::setTransform(pQVar1,&local_80,false);
      }
    }
    (**(code **)(*(long *)this + 0x68))(step,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemAnimation::setStep(qreal step)
{
    if (!check_step_valid(step, "setStep"))
        return;

    beforeAnimationStep(step);

    d->step = step;
    if (d->item) {
        if (!d->xPosition.isEmpty() || !d->yPosition.isEmpty())
            d->item->setPos(posAt(step));
        if (!d->rotation.isEmpty()
            || !d->verticalScale.isEmpty()
            || !d->horizontalScale.isEmpty()
            || !d->verticalShear.isEmpty()
            || !d->horizontalShear.isEmpty()
            || !d->xTranslation.isEmpty()
            || !d->yTranslation.isEmpty()) {
            d->item->setTransform(d->startTransform * transformAt(step));
        }
    }

    afterAnimationStep(step);
}